

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopicTree.h
# Opt level: O2

void __thiscall uWS::TopicTree::trimTree(TopicTree *this,Topic *topic)

{
  Topic *topic_00;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lStack_220;
  Topic *tmp [64];
  
  if ((topic->subs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    return;
  }
  if ((topic->children)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    return;
  }
  if (topic->terminatingWildcardChild != (Topic *)0x0) {
    return;
  }
  if (topic->wildcardChild != (Topic *)0x0) {
    return;
  }
  topic_00 = topic->parent;
  tmp[1] = (Topic *)topic->name;
  tmp[0] = (Topic *)topic->length;
  if (tmp[0] == (Topic *)0x1) {
    if (*(char *)&tmp[1]->name == '#') {
      lStack_220 = 0x58;
    }
    else {
      if (*(char *)&tmp[1]->name != '+') goto LAB_0016a494;
      lStack_220 = 0x50;
    }
    *(undefined8 *)((long)&topic_00->name + lStack_220) = 0;
  }
LAB_0016a494:
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::Topic_*>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::Topic_*>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::Topic_*>_>_>
  ::erase(&(topic_00->children)._M_t,(key_type *)tmp);
  if (topic->triggered == true) {
    uVar3 = 0;
    uVar2 = (ulong)(uint)this->numTriggeredTopics;
    if (this->numTriggeredTopics < 1) {
      uVar2 = uVar3;
    }
    uVar1 = 0;
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      if (this->triggeredTopics[uVar3] != topic) {
        lVar4 = (long)(int)uVar1;
        uVar1 = uVar1 + 1;
        tmp[lVar4] = this->triggeredTopics[uVar3];
      }
    }
    uVar2 = 0;
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      this->triggeredTopics[uVar2] = tmp[uVar2];
    }
    this->numTriggeredTopics = uVar1;
  }
  if (topic->name != (char *)0x0) {
    operator_delete__(topic->name);
  }
  Topic::~Topic(topic);
  operator_delete(topic,0xc0);
  if (topic_00 != this->root) {
    trimTree(this,topic_00);
  }
  return;
}

Assistant:

void trimTree(Topic *topic) {
        if (!topic->subs.size() && !topic->children.size() && !topic->terminatingWildcardChild && !topic->wildcardChild) {
            Topic *parent = topic->parent;

            if (topic->length == 1) {
                if (topic->name[0] == '#') {
                    parent->terminatingWildcardChild = nullptr;
                } else if (topic->name[0] == '+') {
                    parent->wildcardChild = nullptr;
                }
            }
            /* Erase us from our parents set (wildcards also live here) */
            parent->children.erase(std::string_view(topic->name, topic->length));

            /* If this node is triggered, make sure to remove it from the triggered list */
            if (topic->triggered) {
                Topic *tmp[64];
                int length = 0;
                for (int i = 0; i < numTriggeredTopics; i++) {
                    if (triggeredTopics[i] != topic) {
                        tmp[length++] = triggeredTopics[i];
                    }
                }

                for (int i = 0; i < length; i++) {
                    triggeredTopics[i] = tmp[i];
                }
                numTriggeredTopics = length;
            }

            /* Free various memory for the node */
            delete [] topic->name;
            delete topic;

            if (parent != root) {
                trimTree(parent);
            }
        }
    }